

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

void __thiscall djb::tab::compute_cdf(tab *this)

{
  pointer *ppvVar1;
  undefined8 uVar2;
  iterator iVar3;
  vec2 vVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int i2;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float extraout_XMM0_Da;
  float fVar12;
  vec2 local_c0;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  vec2 local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  
  lVar6 = 0;
  lVar8 = 0;
  do {
    fVar9 = (float)(int)lVar8 * 0.03125;
    fVar9 = (fVar9 + fVar9 + -1.0) * 3.1415927;
    local_80 = lVar8;
    local_b0 = cosf(fVar9);
    local_b4 = sinf(fVar9);
    lVar8 = 0;
    local_78 = lVar6;
    do {
      local_98 = SQRT((float)(int)lVar8 / 15.0) * 3.1415927 * 0.5;
      local_70 = lVar8;
      fVar10 = cosf(local_98);
      fVar9 = 0.0;
      if (0.0 <= fVar10) {
        fVar9 = fVar10;
      }
      fVar10 = sinf(local_98);
      local_a8 = local_b0 * fVar10;
      iVar5 = 0x200;
      do {
        local_c0.x = 0.0;
        local_c0.y = 0.0;
        iVar3._M_current =
             (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<djb::vec2,_std::allocator<djb::vec2>_>::_M_realloc_insert<djb::vec2>
                    (&this->m_cdf,iVar3,&local_c0);
        }
        else {
          (iVar3._M_current)->x = 0.0;
          (iVar3._M_current)->y = 0.0;
          ppvVar1 = &(this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppvVar1 = *ppvVar1 + 1;
        }
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      local_ac = 1.0;
      if (fVar9 <= 1.0) {
        local_ac = fVar9;
      }
      fVar10 = fVar10 * local_b4;
      lVar8 = 1;
      local_68 = lVar6;
      do {
        local_a0 = (float)(int)lVar8 * 0.015625;
        fVar9 = local_a0 * local_a0 * 3.1415927 * 0.5;
        local_a4 = cosf(fVar9);
        local_58 = sinf(fVar9);
        fVar9 = 0.0;
        lVar7 = 0;
        fStack_54 = local_58;
        fStack_50 = local_58;
        fStack_4c = local_58;
        local_48 = local_58;
        do {
          fVar11 = (float)(int)lVar7 * 0.001953125;
          local_9c = (fVar11 + fVar11 + -1.0) * 3.1415927;
          local_98 = cosf(local_9c);
          fVar11 = sinf(local_9c);
          local_c0.y = fVar11 * fStack_54;
          local_c0.x = local_98 * local_58;
          local_b8 = local_a4;
          (*(this->super_microfacet).super_brdf._vptr_brdf[0xb])(this,&local_c0);
          fVar12 = local_b8 * local_ac + local_c0.x * local_a8 + local_c0.y * fVar10;
          fVar11 = 0.0;
          if (0.0 <= fVar12) {
            fVar11 = fVar12;
          }
          fVar12 = 1.0;
          if (fVar11 <= 1.0) {
            fVar12 = fVar11;
          }
          fVar12 = fVar12 * extraout_XMM0_Da * local_a0 * local_48;
          fVar9 = fVar12 + fVar9;
          uVar2 = *(undefined8 *)
                   ((long)&(this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar7].x + lVar6);
          fVar11 = fVar9 * 0.09817477 * 0.0061359233 + (float)uVar2;
          fVar12 = fVar12 * 0.0061359233 + (float)((ulong)uVar2 >> 0x20);
          local_60.y = fVar12;
          local_60.x = fVar11;
          iVar3._M_current =
               (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<djb::vec2,_std::allocator<djb::vec2>_>::_M_realloc_insert<djb::vec2>
                      (&this->m_cdf,iVar3,&local_60);
          }
          else {
            vVar4.y = fVar12;
            vVar4.x = fVar11;
            *iVar3._M_current = vVar4;
            ppvVar1 = &(this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppvVar1 = *ppvVar1 + 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x200);
        lVar8 = lVar8 + 1;
        lVar6 = lVar6 + 0x1000;
      } while (lVar8 != 0x40);
      lVar8 = local_70 + 1;
      lVar6 = local_68 + 0x40000;
    } while (lVar8 != 0x10);
    lVar8 = local_80 + 1;
    lVar6 = local_78 + 0x400000;
  } while (lVar8 != 0x20);
  fwrite("djb_verbose: CDF ready\n",0x17,1,_stdout);
  return;
}

Assistant:

void tab::compute_cdf()
{
	int npi = 32;
	int nti = 16;
	int nu2 = 64;
	int nu1 = 512;
	double du2 = (double)m_pi() / nu1;
	double du1 = 2 * (double)m_pi() / nu2;

	for (int i4 = 0; i4 < npi; ++i4) {
		float_t u = (float_t)i4 / npi;   // in [0,1)
		float_t pi = (2 * u - 1) * m_pi(); // in [-pi,pi)
		float_t cpi = cos(pi), spi = sin(pi);

		for (int i3 = 0; i3 < nti; ++i3) {
			float_t u = (float_t)i3 / (nti - 1); // in [0,1]
			float_t ti = sqrt(u) * m_pi() / 2;     // in [0,pi/2]
			float_t zi = sat(cos(ti)), z_i = sin(ti);
			vec3 wi = vec3(z_i * cpi, z_i * spi, zi);

			// bottom row (zeroes since z_m = 0)
			for (int i1 = 0; i1 < nu1; ++i1)
				m_cdf.push_back(vec2(0));

			// rest of the domain
			for (int i2 = 1; i2 < nu2; ++i2) {
				float_t u2 = (float_t)i2 / nu2;   // in (0,1)
				float_t tm = sqr(u2) * m_pi() / 2;  // in [0,pi/2)
				float_t ctm = cos(tm), stm = sin(tm);
				double nint = 0;

				for (int i1 = 0; i1 < nu1; ++i1) {
					float_t u1 = (float_t)i1 / nu1;    // in [0,1)
					float_t pm = (2 * u1 - 1) * m_pi();  // in [phi_i-pi/2,phi_i+pi/2)
					float_t cpm = cos(pm), spm = sin(pm);
					vec3 wm = vec3(stm * cpm, stm * spm, ctm);
					float_t ndf = ndf_std(wm);
					float_t dp = sat(dot(wm, wi));
					int idx = i1 + nu1 * (i2 - 1 + nu2 * (i3 + nti * i4));
					vec2 nint2 = m_cdf[idx];
					float_t tmp = dp * ndf * u2 * stm;

					nint+= (double)tmp;
					m_cdf.push_back(vec2(nint * du1, tmp) * du2 + nint2);
				}
			}
		}
	}

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: CDF ready\n");
#endif
}